

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_transaction.cpp
# Opt level: O0

void __thiscall
Transaction_GetSignatureHash_Test::Transaction_GetSignatureHash_Test
          (Transaction_GetSignatureHash_Test *this)

{
  Transaction_GetSignatureHash_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Transaction_GetSignatureHash_Test_009df2f8;
  return;
}

Assistant:

TEST(Transaction, GetSignatureHash) {
  {
    // witness
    Transaction tx(
        "0100000002fff7f7881a8099afa6940d42d1e7f6362bec38171ea3edf433541db4e4ad969f0000000000eeffffffef51e1b804cc89d182d279655c3aa89e815b1b309fe287d9b2b55d57b90ec68a0100000000ffffffff02202cb206000000001976a9148280b37df378db99f66f85c95a783a76ac7a6d5988ac9093510d000000001976a9143bde42dbee7e4dbe6a21b2d50ce2f0167faa815988ac11000000");
    ByteData script("76a9141d0f172a0ecb48aee1be1f2687d2963ae33f71a188ac");
    SigHashType sighashtype(SigHashAlgorithm::kSigHashAll, false);
    ByteData256 sighash;
    sighash = tx.GetSignatureHash(1, script, sighashtype,
                                  Amount::CreateByCoinAmount(6), WitnessVersion::kVersion0);
    EXPECT_STREQ(
        sighash.GetHex().c_str(),
        "c37af31116d1b27caf68aae9e3ac82f1477929014d5b917657d0eb49478cb670");
  }

  {
    // legacy
    Transaction tx(
        "01000000019c53cb2a6118530aaa345b799aeb7e4e5055de41ac5b2dd2ce47419624c57b580000000000ffffffff0130ea052a010000001976a9143cadb10040e9e7002bbd9d0620f5f79c05603ffd88ac00000000");
    ByteData script("76a9141462eca4b9b8d8df63550abd24d0cb64e8f2d74688ac");
    SigHashType sighashtype(SigHashAlgorithm::kSigHashAll, false);
    ByteData256 sighash;
    sighash = tx.GetSignatureHash(0, script, sighashtype);
    EXPECT_STREQ(
        sighash.GetHex().c_str(),
        "f66fdcfbe73820d26162111873d76062bb3e1b23bc9eaf6ab8a3b333f4bc5242");
  }

  {
    // error
    Transaction tx(
        "01000000019c53cb2a6118530aaa345b799aeb7e4e5055de41ac5b2dd2ce47419624c57b580000000000ffffffff0130ea052a010000001976a9143cadb10040e9e7002bbd9d0620f5f79c05603ffd88ac00000000");
    ByteData empty_script;
    SigHashType sighashtype(SigHashAlgorithm::kSigHashAll, false);
    ByteData256 sighash;
    EXPECT_THROW((sighash = tx.GetSignatureHash(0, empty_script, sighashtype)), CfdException);
  }
}